

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_lha_filename_utf16.c
# Opt level: O0

void test_read_format_lha_filename_UTF16_UTF8(char *refname)

{
  int iVar1;
  wchar_t wVar2;
  char *pcVar3;
  la_int64_t lVar4;
  archive_entry *local_20;
  archive_entry *ae;
  archive *a;
  char *refname_local;
  
  a = (archive *)refname;
  pcVar3 = setlocale(6,"en_US.UTF-8");
  if (pcVar3 == (char *)0x0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_lha_filename_utf16.c"
                   ,L'\'');
    test_skipping("en_US.UTF-8 locale not available on this system.");
  }
  else {
    ae = (archive_entry *)archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_lha_filename_utf16.c"
                     ,L'0',(uint)(ae != (archive_entry *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_read_support_format_all((archive *)ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_lha_filename_utf16.c"
                        ,L'1',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",ae);
    iVar1 = archive_read_set_options((archive *)ae,"hdrcharset=CP932");
    if (iVar1 == 0) {
      iVar1 = archive_read_set_options((archive *)ae,"hdrcharset=UTF-16");
      if (iVar1 == 0) {
        iVar1 = archive_read_free((archive *)ae);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_lha_filename_utf16.c"
                            ,L'>',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
        ae = (archive_entry *)archive_read_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_lha_filename_utf16.c"
                         ,L'?',(uint)(ae != (archive_entry *)0x0),"(a = archive_read_new()) != NULL"
                         ,(void *)0x0);
        iVar1 = archive_read_support_filter_all((archive *)ae);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_lha_filename_utf16.c"
                            ,L'@',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",ae
                           );
        iVar1 = archive_read_support_format_all((archive *)ae);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_lha_filename_utf16.c"
                            ,L'A',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",ae
                           );
        wVar2 = archive_read_open_filename((archive_conflict *)ae,(char *)a,0x2800);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_lha_filename_utf16.c"
                            ,L'C',0,"ARCHIVE_OK",(long)wVar2,
                            "archive_read_open_filename(a, refname, 10240)",ae);
        iVar1 = archive_read_next_header((archive *)ae,&local_20);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_lha_filename_utf16.c"
                            ,L'[',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",ae);
        pcVar3 = archive_entry_pathname(local_20);
        assertion_equal_string
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_lha_filename_utf16.c"
                   ,L'\\',anon_var_dwarf_28115,"UMLAUT_DIRNAME UMLAUT_FNAME",pcVar3,
                   "archive_entry_pathname(ae)",(void *)0x0,L'\0');
        lVar4 = archive_entry_size(local_20);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_lha_filename_utf16.c"
                            ,L']',0xc,"12",lVar4,"archive_entry_size(ae)",(void *)0x0);
        iVar1 = archive_read_next_header((archive *)ae,&local_20);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_lha_filename_utf16.c"
                            ,L'`',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",ae);
        pcVar3 = archive_entry_pathname(local_20);
        assertion_equal_string
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_lha_filename_utf16.c"
                   ,L'a',anon_var_dwarf_28183,"UMLAUT_DIRNAME",pcVar3,"archive_entry_pathname(ae)",
                   (void *)0x0,L'\0');
        lVar4 = archive_entry_size(local_20);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_lha_filename_utf16.c"
                            ,L'b',0,"0",lVar4,"archive_entry_size(ae)",(void *)0x0);
        iVar1 = archive_read_next_header((archive *)ae,&local_20);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_lha_filename_utf16.c"
                            ,L'e',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",ae);
        pcVar3 = archive_entry_pathname(local_20);
        assertion_equal_string
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_lha_filename_utf16.c"
                   ,L'g',anon_var_dwarf_281c5,"UMLAUT_DIRNAME KATAKANA_FNAME",pcVar3,
                   "archive_entry_pathname(ae)",(void *)0x0,L'\0');
        lVar4 = archive_entry_size(local_20);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_lha_filename_utf16.c"
                            ,L'h',0x19,"25",lVar4,"archive_entry_size(ae)",(void *)0x0);
        iVar1 = archive_read_next_header((archive *)ae,&local_20);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_lha_filename_utf16.c"
                            ,L'k',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",ae);
        pcVar3 = archive_entry_pathname(local_20);
        assertion_equal_string
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_lha_filename_utf16.c"
                   ,L'm',anon_var_dwarf_281e3,"KATAKANA_DIRNAME UMLAUT_FNAME",pcVar3,
                   "archive_entry_pathname(ae)",(void *)0x0,L'\0');
        lVar4 = archive_entry_size(local_20);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_lha_filename_utf16.c"
                            ,L'n',0xc,"12",lVar4,"archive_entry_size(ae)",(void *)0x0);
        iVar1 = archive_read_next_header((archive *)ae,&local_20);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_lha_filename_utf16.c"
                            ,L'q',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",ae);
        pcVar3 = archive_entry_pathname(local_20);
        assertion_equal_string
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_lha_filename_utf16.c"
                   ,L'r',anon_var_dwarf_281f7,"KATAKANA_DIRNAME",pcVar3,"archive_entry_pathname(ae)"
                   ,(void *)0x0,L'\0');
        lVar4 = archive_entry_size(local_20);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_lha_filename_utf16.c"
                            ,L's',0,"0",lVar4,"archive_entry_size(ae)",(void *)0x0);
        iVar1 = archive_read_next_header((archive *)ae,&local_20);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_lha_filename_utf16.c"
                            ,L'v',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",ae);
        pcVar3 = archive_entry_pathname(local_20);
        assertion_equal_string
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_lha_filename_utf16.c"
                   ,L'w',anon_var_dwarf_281e3 + 10,"UMLAUT_FNAME",pcVar3,
                   "archive_entry_pathname(ae)",(void *)0x0,L'\0');
        lVar4 = archive_entry_size(local_20);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_lha_filename_utf16.c"
                            ,L'x',0xc,"12",lVar4,"archive_entry_size(ae)",(void *)0x0);
        iVar1 = archive_read_next_header((archive *)ae,&local_20);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_lha_filename_utf16.c"
                            ,L'{',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",ae)
        ;
        iVar1 = archive_filter_code((archive *)ae,0);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_lha_filename_utf16.c"
                            ,L'~',0,"ARCHIVE_FILTER_NONE",(long)iVar1,"archive_filter_code(a, 0)",ae
                           );
        iVar1 = archive_format((archive *)ae);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_lha_filename_utf16.c"
                            ,L'\x7f',0xb0000,"ARCHIVE_FORMAT_LHA",(long)iVar1,"archive_format(a)",ae
                           );
        iVar1 = archive_read_close((archive *)ae);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_lha_filename_utf16.c"
                            ,L'\x82',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0)
        ;
        iVar1 = archive_read_free((archive *)ae);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_lha_filename_utf16.c"
                            ,L'\x83',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
      }
      else {
        iVar1 = archive_read_free((archive *)ae);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_lha_filename_utf16.c"
                            ,L'9',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
        skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_lha_filename_utf16.c"
                       ,L':');
        test_skipping("This system cannot convert character-set from UTF-16 to UTF-8.");
      }
    }
    else {
      iVar1 = archive_read_free((archive *)ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_lha_filename_utf16.c"
                          ,L'3',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_lha_filename_utf16.c"
                     ,L'4');
      test_skipping("This system cannot convert character-set from CP932 to UTF-8.");
    }
  }
  return;
}

Assistant:

static void
test_read_format_lha_filename_UTF16_UTF8(const char *refname)
{
	struct archive *a;
	struct archive_entry *ae;

	/*
	 * Read LHA filename in en_US.UTF-8.
	 */
	if (NULL == setlocale(LC_ALL, "en_US.UTF-8")) {
		skipping("en_US.UTF-8 locale not available on this system.");
		return;
	}
	/*
	 * Create a read object only for a test that platform support
	 * a character-set conversion because we can read a character-set
	 * of filenames from the header of an lha archive file and so we
	 * want to test that it works well. 
	 */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
    if (ARCHIVE_OK != archive_read_set_options(a, "hdrcharset=CP932")) {
        assertEqualInt(ARCHIVE_OK, archive_read_free(a));
        skipping("This system cannot convert character-set"
            " from CP932 to UTF-8.");
        return;
    }
	if (ARCHIVE_OK != archive_read_set_options(a, "hdrcharset=UTF-16")) {
		assertEqualInt(ARCHIVE_OK, archive_read_free(a));
		skipping("This system cannot convert character-set"
		    " from UTF-16 to UTF-8.");
		return;
	}
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_filename(a, refname, 10240));

	/* Note that usual Japanese filenames are tested in other cases */
#if defined(__APPLE__)
 /* NFD normalization */
 /* U:O:A:u:o:a: */
 #define UMLAUT_DIRNAME "\x55\xcc\x88\x4f\xcc\x88\x41\xcc\x88\x75\xcc\x88\x6f"\
	    "\xcc\x88\x61\xcc\x88/"
 /* a:o:u:A:O:U:.txt */
 #define UMLAUT_FNAME "\x61\xcc\x88\x6f\xcc\x88\x75\xcc\x88\x41\xcc\x88"\
	    "\x4f\xcc\x88\x55\xcc\x88.txt"
#else
 /* NFC normalization */
 /* U:O:A:u:o:a: */
 #define UMLAUT_DIRNAME "\xc3\x9c\xc3\x96\xc3\x84\xc3\xbc\xc3\xb6\xc3\xa4/"
 /* a:o:u:A:O:U:.txt */
 #define UMLAUT_FNAME "\xc3\xa4\xc3\xb6\xc3\xbc\xc3\x84\xc3\x96\xc3\x9c.txt"
#endif

/* "Test" in Japanese Katakana */
#define KATAKANA_FNAME "\xe3\x83\x86\xe3\x82\xb9\xe3\x83\x88.txt"
#define KATAKANA_DIRNAME "\xe3\x83\x86\xe3\x82\xb9\xe3\x83\x88/"

	/* Verify regular file. U:O:A:u:o:a:/a:o:u:A:O:U:.txt */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString(UMLAUT_DIRNAME UMLAUT_FNAME, archive_entry_pathname(ae));
	assertEqualInt(12, archive_entry_size(ae));

	/* Verify directory. U:O:A:u:o:a:/ */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString(UMLAUT_DIRNAME, archive_entry_pathname(ae));
	assertEqualInt(0, archive_entry_size(ae));

	/* Verify regular file. U:O:A:u:o:a:/("Test" in Japanese).txt */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString(UMLAUT_DIRNAME KATAKANA_FNAME,
	    archive_entry_pathname(ae));
	assertEqualInt(25, archive_entry_size(ae));

	/* Verify regular file. ("Test" in Japanese)/a:o:u:A:O:U:.txt */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString(KATAKANA_DIRNAME UMLAUT_FNAME,
	    archive_entry_pathname(ae));
	assertEqualInt(12, archive_entry_size(ae));

	/* Verify directory. ("Test" in Japanese)/ */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString(KATAKANA_DIRNAME, archive_entry_pathname(ae));
	assertEqualInt(0, archive_entry_size(ae));

	/* Verify regular file. a:o:u:A:O:U:.txt */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString(UMLAUT_FNAME, archive_entry_pathname(ae));
	assertEqualInt(12, archive_entry_size(ae));

	/* End of archive. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify archive format. */
	assertEqualIntA(a, ARCHIVE_FILTER_NONE, archive_filter_code(a, 0));
	assertEqualIntA(a, ARCHIVE_FORMAT_LHA, archive_format(a));

	/* Close the archive. */
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}